

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O2

pair<skiwi::scm_type,_skiwi::scm_type> __thiscall skiwi::scm_type::get_pair(scm_type *this)

{
  uint64_t rax;
  uint64_t rax_00;
  bool bVar1;
  uint64_t *puVar2;
  runtime_error *this_00;
  scm_type extraout_RDX;
  scm_type *in_RSI;
  pair<skiwi::scm_type,_skiwi::scm_type> pVar3;
  scm_type local_20;
  
  bVar1 = is_pair(in_RSI);
  if (bVar1) {
    puVar2 = get_address_from_block(in_RSI->scm_value);
    rax = puVar2[1];
    rax_00 = puVar2[2];
    std::pair<skiwi::scm_type,_skiwi::scm_type>::pair<skiwi::scm_type,_skiwi::scm_type,_true>
              ((pair<skiwi::scm_type,_skiwi::scm_type> *)this);
    scm_type(&local_20,rax);
    this->scm_value = (uint64_t)local_20;
    ~scm_type(&local_20);
    scm_type(&local_20,rax_00);
    this[1].scm_value = local_20.scm_value;
    ~scm_type(&local_20);
    pVar3.second.scm_value = extraout_RDX.scm_value;
    pVar3.first.scm_value = (uint64_t)this;
    return pVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"skiwi error: not a pair");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::pair<scm_type, scm_type> scm_type::get_pair() const
  {
  if (!is_pair())
    throw std::runtime_error("skiwi error: not a pair");
  uint64_t* addr = get_address_from_block(scm_value);
  uint64_t first = *((uint64_t*)(addr + 1));
  uint64_t second = *((uint64_t*)(addr + 2));
  std::pair<scm_type, scm_type> out;
  out.first = scm_type(first);
  out.second = scm_type(second);
  return out;
  }